

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O2

void ImTui::ShowStyleEditor(ImGuiStyle *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImFontAtlas *pIVar3;
  ImFont *this;
  ImFontConfig *pIVar4;
  float fVar5;
  float fVar6;
  ImVec2 pos;
  bool bVar7;
  bool bVar8;
  ImU32 IVar9;
  ImGuiStyle *v;
  char *pcVar10;
  size_t sVar11;
  ImGuiIO *pIVar12;
  ImFontGlyph *pIVar13;
  ImDrawList *this_00;
  int i;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ImVec4 *pIVar18;
  ImWchar c;
  uint uVar19;
  uint base;
  void *ptr_id;
  uint n;
  int iVar20;
  ImGuiStyle *__dest;
  ImVec4 *pIVar21;
  int i_1;
  uint uVar22;
  float fVar23;
  ImVec2 IVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool window_border;
  undefined7 uStack_c7;
  float fStack_c4;
  undefined8 uStack_c0;
  float local_b4;
  float *local_b0;
  ImVec2 cell_p2;
  float local_78;
  float fStack_74;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = ImGui::GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar20 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar20 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar23 = ImGui::GetWindowWidth();
  ImGui::PushItemWidth(fVar23 * 0.5);
  bVar7 = ImGui::ShowStyleSelector("Colors##Selector");
  if (bVar7) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
  }
  ImGui::ShowFontSelector("Fonts##Selector");
  local_b0 = &v->FrameRounding;
  bVar7 = ImGui::SliderFloat("FrameRounding",local_b0,0.0,12.0,"%.0f",0);
  if (bVar7) {
    v->GrabRounding = v->FrameRounding;
  }
  window_border = 0.0 < v->WindowBorderSize;
  bVar7 = ImGui::Checkbox("WindowBorder",&window_border);
  if (bVar7) {
    if (window_border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->WindowBorderSize = fVar23;
  }
  ImGui::SameLine(0.0,-1.0);
  window_border = 0.0 < v->FrameBorderSize;
  bVar7 = ImGui::Checkbox("FrameBorder",&window_border);
  if (bVar7) {
    if (window_border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->FrameBorderSize = fVar23;
  }
  ImGui::SameLine(0.0,-1.0);
  window_border = 0.0 < v->PopupBorderSize;
  bVar7 = ImGui::Checkbox("PopupBorder",&window_border);
  if (bVar7) {
    if (window_border == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 1.0;
    }
    v->PopupBorderSize = fVar23;
  }
  _window_border = 0.0;
  fStack_c4 = 0.0;
  bVar7 = ImGui::Button("Save Ref",(ImVec2 *)&window_border);
  if (bVar7) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x414);
    memmove(__dest,v,0x414);
  }
  ImGui::SameLine(0.0,-1.0);
  _window_border = 0.0;
  fStack_c4 = 0.0;
  bVar7 = ImGui::Button("Revert Ref",(ImVec2 *)&window_border);
  if (bVar7) {
    memcpy(v,__dest,0x414);
  }
  ImGui::SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  ImGui::Separator();
  bVar7 = ImGui::BeginTabBar("##tabs",0);
  if (bVar7) {
    bVar7 = ImGui::BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar7) {
      ImGui::Text("Main");
      ImGui::SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",0);
      ImGui::SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",0);
      ImGui::SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",0);
      ImGui::SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",0);
      ImGui::SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",0);
      ImGui::Text("Borders");
      ImGui::SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",0);
      ImGui::SliderFloat("TabBorderSize",&v->TabBorderSize,0.0,1.0,"%.0f",0);
      ImGui::Text("Rounding");
      ImGui::SliderFloat("WindowRounding",&v->WindowRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("ChildRounding",&v->ChildRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("FrameRounding",local_b0,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("PopupRounding",&v->PopupRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",0);
      ImGui::SliderFloat("TabRounding",&v->TabRounding,0.0,12.0,"%.0f",0);
      ImGui::Text("Alignment");
      ImGui::SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",0);
      _window_border = (float)(v->WindowMenuButtonPosition + 1);
      bVar7 = ImGui::Combo("WindowMenuButtonPosition",(int *)&window_border,"None",-1);
      if (bVar7) {
        v->WindowMenuButtonPosition = (int)_window_border + -1;
      }
      ImGui::Combo("ColorButtonPosition",&v->ColorButtonPosition,"Left",-1);
      ImGui::SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",0);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      ImGui::SliderFloat2("SelectableTextAlign",&(v->SelectableTextAlign).x,0.0,1.0,"%.2f",0);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      ImGui::Text("Safe Area Padding");
      ImGui::SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      ImGui::SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",0)
      ;
      ImGui::EndTabItem();
    }
    bVar7 = ImGui::BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar7) {
      _window_border = 0.0;
      fStack_c4 = 0.0;
      bVar7 = ImGui::Button("Export",(ImVec2 *)&window_border);
      if (bVar7) {
        if (ShowStyleEditor::output_dest == 0) {
          ImGui::LogToClipboard(-1);
        }
        else {
          ImGui::LogToTTY(-1);
        }
        ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar21 = v->Colors;
        pIVar18 = __dest->Colors;
        for (lVar15 = 0; lVar15 != 0x35; lVar15 = lVar15 + 1) {
          pcVar10 = ImGui::GetStyleColorName((ImGuiCol)lVar15);
          if (ShowStyleEditor::output_only_modified == true) {
            auVar25[0] = -(*(char *)&pIVar21->x == *(char *)&pIVar18->x);
            auVar25[1] = -(*(char *)((long)&pIVar21->x + 1) == *(char *)((long)&pIVar18->x + 1));
            auVar25[2] = -(*(char *)((long)&pIVar21->x + 2) == *(char *)((long)&pIVar18->x + 2));
            auVar25[3] = -(*(char *)((long)&pIVar21->x + 3) == *(char *)((long)&pIVar18->x + 3));
            auVar25[4] = -(*(char *)&pIVar21->y == *(char *)&pIVar18->y);
            auVar25[5] = -(*(char *)((long)&pIVar21->y + 1) == *(char *)((long)&pIVar18->y + 1));
            auVar25[6] = -(*(char *)((long)&pIVar21->y + 2) == *(char *)((long)&pIVar18->y + 2));
            auVar25[7] = -(*(char *)((long)&pIVar21->y + 3) == *(char *)((long)&pIVar18->y + 3));
            auVar25[8] = -(*(char *)&pIVar21->z == *(char *)&pIVar18->z);
            auVar25[9] = -(*(char *)((long)&pIVar21->z + 1) == *(char *)((long)&pIVar18->z + 1));
            auVar25[10] = -(*(char *)((long)&pIVar21->z + 2) == *(char *)((long)&pIVar18->z + 2));
            auVar25[0xb] = -(*(char *)((long)&pIVar21->z + 3) == *(char *)((long)&pIVar18->z + 3));
            auVar25[0xc] = -(*(char *)&pIVar21->w == *(char *)&pIVar18->w);
            auVar25[0xd] = -(*(char *)((long)&pIVar21->w + 1) == *(char *)((long)&pIVar18->w + 1));
            auVar25[0xe] = -(*(char *)((long)&pIVar21->w + 2) == *(char *)((long)&pIVar18->w + 2));
            auVar25[0xf] = -(*(char *)((long)&pIVar21->w + 3) == *(char *)((long)&pIVar18->w + 3));
            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010a185;
          }
          else {
LAB_0010a185:
            sVar11 = strlen(pcVar10);
            ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                           (double)pIVar21->x,(double)pIVar21->y,(double)pIVar21->z,
                           (double)pIVar21->w,pcVar10,(ulong)(0x17 - (int)sVar11),"");
          }
          pIVar18 = pIVar18 + 1;
          pIVar21 = pIVar21 + 1;
        }
        ImGui::LogFinish();
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::SetNextItemWidth(120.0);
      ImGui::Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      ImGui::SameLine(0.0,-1.0);
      ImGui::Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar20 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar20 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar23 = ImGui::GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar23 * 16.0);
      ImGui::RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
      ImGui::SameLine(0.0,-1.0);
      ImGui::RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x20000);
      ImGui::SameLine(0.0,-1.0);
      ImGui::RadioButton("Both",&ShowStyleEditor::alpha_flags,0x40000);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu."
                );
      _window_border = 0.0;
      fStack_c4 = 0.0;
      ImGui::BeginChild("##colors",(ImVec2 *)&window_border,true,0x80c000);
      fVar23 = ImGui::GetWindowWidth();
      ImGui::PushItemWidth(fVar23 * 0.5);
      pIVar18 = v->Colors;
      pIVar21 = __dest->Colors;
      for (lVar15 = 0; lVar15 != 0x35; lVar15 = lVar15 + 1) {
        pcVar10 = ImGui::GetStyleColorName((ImGuiCol)lVar15);
        bVar7 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar10,(char *)0x0);
        if (bVar7) {
          ImGui::PushID((ImGuiCol)lVar15);
          ImGui::ColorEdit4("##color",&pIVar18->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar26[0] = -(*(char *)&pIVar18->x == *(char *)&pIVar21->x);
          auVar26[1] = -(*(char *)((long)&pIVar18->x + 1) == *(char *)((long)&pIVar21->x + 1));
          auVar26[2] = -(*(char *)((long)&pIVar18->x + 2) == *(char *)((long)&pIVar21->x + 2));
          auVar26[3] = -(*(char *)((long)&pIVar18->x + 3) == *(char *)((long)&pIVar21->x + 3));
          auVar26[4] = -(*(char *)&pIVar18->y == *(char *)&pIVar21->y);
          auVar26[5] = -(*(char *)((long)&pIVar18->y + 1) == *(char *)((long)&pIVar21->y + 1));
          auVar26[6] = -(*(char *)((long)&pIVar18->y + 2) == *(char *)((long)&pIVar21->y + 2));
          auVar26[7] = -(*(char *)((long)&pIVar18->y + 3) == *(char *)((long)&pIVar21->y + 3));
          auVar26[8] = -(*(char *)&pIVar18->z == *(char *)&pIVar21->z);
          auVar26[9] = -(*(char *)((long)&pIVar18->z + 1) == *(char *)((long)&pIVar21->z + 1));
          auVar26[10] = -(*(char *)((long)&pIVar18->z + 2) == *(char *)((long)&pIVar21->z + 2));
          auVar26[0xb] = -(*(char *)((long)&pIVar18->z + 3) == *(char *)((long)&pIVar21->z + 3));
          auVar26[0xc] = -(*(char *)&pIVar18->w == *(char *)&pIVar21->w);
          auVar26[0xd] = -(*(char *)((long)&pIVar18->w + 1) == *(char *)((long)&pIVar21->w + 1));
          auVar26[0xe] = -(*(char *)((long)&pIVar18->w + 2) == *(char *)((long)&pIVar21->w + 2));
          auVar26[0xf] = -(*(char *)((long)&pIVar18->w + 3) == *(char *)((long)&pIVar21->w + 3));
          if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar26[0xf] >> 7) << 0xf) != 0xffff) {
            ImGui::SameLine(0.0,(v->ItemInnerSpacing).x);
            _window_border = 0.0;
            fStack_c4 = 0.0;
            bVar7 = ImGui::Button("Save",(ImVec2 *)&window_border);
            if (bVar7) {
              fVar23 = pIVar18->y;
              fVar5 = pIVar18->z;
              fVar6 = pIVar18->w;
              pIVar21->x = pIVar18->x;
              pIVar21->y = fVar23;
              pIVar21->z = fVar5;
              pIVar21->w = fVar6;
            }
            ImGui::SameLine(0.0,(v->ItemInnerSpacing).x);
            _window_border = 0.0;
            fStack_c4 = 0.0;
            bVar7 = ImGui::Button("Revert",(ImVec2 *)&window_border);
            if (bVar7) {
              fVar23 = pIVar21->y;
              fVar5 = pIVar21->z;
              fVar6 = pIVar21->w;
              pIVar18->x = pIVar21->x;
              pIVar18->y = fVar23;
              pIVar18->z = fVar5;
              pIVar18->w = fVar6;
            }
          }
          ImGui::SameLine(0.0,(v->ItemInnerSpacing).x);
          ImGui::TextUnformatted(pcVar10,(char *)0x0);
          ImGui::PopID();
        }
        pIVar21 = pIVar21 + 1;
        pIVar18 = pIVar18 + 1;
      }
      ImGui::PopItemWidth();
      ImGui::EndChild();
      ImGui::EndTabItem();
    }
    bVar7 = ImGui::BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar7) {
      pIVar12 = ImGui::GetIO();
      pIVar3 = pIVar12->Fonts;
      HelpMarker("Read FAQ and docs/FONTS.txt for details on font loading.");
      ImGui::PushItemWidth(120.0);
      for (uVar17 = 0; (long)uVar17 < (long)(pIVar3->Fonts).Size; uVar17 = uVar17 + 1) {
        this = (pIVar3->Fonts).Data[uVar17];
        ImGui::PushID(this);
        pcVar10 = this->ConfigData->Name;
        if (this->ConfigData == (ImFontConfig *)0x0) {
          pcVar10 = "";
        }
        bVar7 = ImGui::TreeNode(this,"Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                                (double)this->FontSize,uVar17 & 0xffffffff,pcVar10,
                                (ulong)(uint)(this->Glyphs).Size,
                                (ulong)(uint)(int)this->ConfigDataCount);
        ImGui::SameLine(0.0,-1.0);
        bVar8 = ImGui::SmallButton("Set as default");
        if (bVar8) {
          pIVar12->FontDefault = this;
        }
        if (bVar7) {
          ImGui::PushFont((ImFont *)0x10a51b);
          ImGui::Text("The quick brown fox jumps over the lazy dog");
          ImGui::PopFont();
          ImGui::DragFloat("Font scale",&this->Scale,0.005,0.3,2.0,"%.1f",0);
          ImGui::SameLine(0.0,-1.0);
          HelpMarker(
                    "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                    );
          ImGui::Text("Ascent: %f, Descent: %f, Height: %f",(double)this->Ascent,
                      (double)this->Descent,(double)(this->Ascent - this->Descent));
          ImGui::Text("Fallback character: \'%c\' (U+%04X)",(ulong)this->FallbackChar);
          ImGui::Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)this->EllipsisChar);
          fVar23 = (float)this->MetricsTotalSurface;
          if (fVar23 < 0.0) {
            fVar23 = sqrtf(fVar23);
          }
          else {
            fVar23 = SQRT(fVar23);
          }
          ImGui::Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)this->MetricsTotalSurface,
                      (ulong)(uint)(int)fVar23);
          lVar15 = 0x56;
          for (uVar16 = 0; (long)uVar16 < (long)this->ConfigDataCount; uVar16 = uVar16 + 1) {
            pIVar4 = this->ConfigData;
            if (pIVar4 != (ImFontConfig *)0x0) {
              ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",
                                uVar16 & 0xffffffff,pIVar4->Name + lVar15 + -0x56,
                                (ulong)*(uint *)((long)pIVar4 + lVar15 + -0x3e),
                                (ulong)*(uint *)((long)pIVar4 + lVar15 + -0x3a),
                                (ulong)*(byte *)((long)pIVar4 + lVar15 + -0x36));
            }
            lVar15 = lVar15 + 0x88;
          }
          bVar7 = ImGui::TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(this->Glyphs).Size);
          if (bVar7) {
            for (ptr_id = (void *)0x0; ptr_id < (void *)0x10000;
                ptr_id = (void *)((long)ptr_id + 0x100)) {
              uVar16 = 0;
              for (iVar20 = 0; iVar14 = (int)uVar16, iVar20 != 0x100; iVar20 = iVar20 + 1) {
                pIVar13 = ImFont::FindGlyphNoFallback(this,(short)iVar20 + (short)ptr_id);
                uVar16 = (ulong)((iVar14 + 1) - (uint)(pIVar13 == (ImFontGlyph *)0x0));
              }
              if (iVar14 != 0) {
                pcVar10 = "glyphs";
                if (iVar14 == 1) {
                  pcVar10 = "glyph";
                }
                bVar7 = ImGui::TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff,
                                        (ulong)((uint)ptr_id | 0xff),uVar16,pcVar10);
                if (bVar7) {
                  local_b0 = (float *)CONCAT44(local_b0._4_4_,this->FontSize);
                  local_b4 = (v->ItemSpacing).y + this->FontSize;
                  IVar24 = ImGui::GetCursorScreenPos();
                  this_00 = ImGui::GetWindowDrawList();
                  fStack_74 = IVar24.y;
                  uVar16 = 0;
                  while (uVar22 = (uint)uVar16, uVar22 != 0x100) {
                    local_78 = IVar24.x;
                    _window_border = (float)(uVar22 & 0xf) * local_b4 + local_78;
                    fStack_c4 = (float)(int)(uVar16 >> 4) * local_b4 + fStack_74;
                    cell_p2.y = fStack_c4 + local_b0._0_4_;
                    cell_p2.x = _window_border + local_b0._0_4_;
                    uVar19 = uVar22 + (uint)ptr_id;
                    c = (ImWchar)uVar19;
                    pIVar13 = ImFont::FindGlyphNoFallback(this,c);
                    IVar9 = 0x64ffffff;
                    if (pIVar13 == (ImFontGlyph *)0x0) {
                      IVar9 = 0x32ffffff;
                    }
                    ImDrawList::AddRect(this_00,(ImVec2 *)&window_border,&cell_p2,IVar9,0.0,0xf,1.0)
                    ;
                    pos = _window_border;
                    if (pIVar13 != (ImFontGlyph *)0x0) {
                      IVar9 = ImGui::GetColorU32(0,1.0);
                      ImFont::RenderChar(this,this_00,local_b0._0_4_,pos,IVar9,c);
                      bVar7 = ImGui::IsMouseHoveringRect((ImVec2 *)&window_border,&cell_p2,true);
                      if (bVar7) {
                        ImGui::BeginTooltip();
                        ImGui::Text("Codepoint: U+%04X",(ulong)uVar19);
                        ImGui::Separator();
                        ImGui::Text("AdvanceX: %.1f",(double)pIVar13->AdvanceX);
                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar13->X0,
                                    (double)pIVar13->Y0,(double)pIVar13->X1,(double)pIVar13->Y1);
                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar13->U0,
                                    (double)pIVar13->V0,(double)pIVar13->U1,(double)pIVar13->V1);
                        ImGui::EndTooltip();
                      }
                    }
                    uVar16 = (ulong)(uVar22 + 1);
                  }
                  fStack_c4 = local_b4 * 16.0;
                  _window_border = local_b4 * 16.0;
                  ImGui::Dummy((ImVec2 *)&window_border);
                  ImGui::TreePop();
                }
              }
            }
            ImGui::TreePop();
          }
          ImGui::TreePop();
        }
        ImGui::PopID();
      }
      bVar7 = ImGui::TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",
                              (ulong)(uint)pIVar3->TexWidth);
      if (bVar7) {
        _window_border = 1.0;
        fStack_c4 = 1.0;
        uStack_c0._0_4_ = 1.0;
        uStack_c0._4_4_ = 1.0;
        cell_p2.x = 1.0;
        cell_p2.y = 1.0;
        uVar1 = pIVar3->TexWidth;
        uVar2 = pIVar3->TexHeight;
        local_38.x = (float)(int)uVar1;
        local_38.y = (float)(int)uVar2;
        local_40.x = 0.0;
        local_40.y = 0.0;
        local_48.x = 1.0;
        local_48.y = 1.0;
        ImGui::Image(pIVar3->TexID,&local_38,&local_40,&local_48,(ImVec4 *)&window_border,
                     (ImVec4 *)&cell_p2);
        ImGui::TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure."
                );
      bVar7 = ImGui::DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",0)
      ;
      if (bVar7) {
        ImGui::SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      ImGui::DragFloat("global scale",&pIVar12->FontGlobalScale,0.005,0.3,2.0,"%.2f",0);
      ImGui::PopItemWidth();
      ImGui::EndTabItem();
    }
    bVar7 = ImGui::BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar7) {
      ImGui::Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
      ImGui::SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      ImGui::Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
      ImGui::PushItemWidth(100.0);
      ImGui::DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,
                       3.4028235e+38,"%.2f",0x20);
      if (v->CurveTessellationTol <= 0.1 && v->CurveTessellationTol != 0.1) {
        v->CurveTessellationTol = 0.1;
      }
      ImGui::DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",0);
      ImGui::PopItemWidth();
      ImGui::EndTabItem();
    }
    ImGui::EndTabBar();
  }
  ImGui::PopItemWidth();
  return;
}

Assistant:

void ImTui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding"); ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
            ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
            ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf); ImGui::SameLine();
            HelpMarker("In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(ImGui::GetWindowWidth()*0.5f);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                    // Read the FAQ and docs/FONTS.txt about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.txt for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                bool font_details_opened = ImGui::TreeNode(font, "Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
                ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) { io.FontDefault = font; }
                if (font_details_opened)
                {
                    ImGui::PushFont(font);
                    ImGui::Text("The quick brown fox jumps over the lazy dog");
                    ImGui::PopFont();
                    ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                    ImGui::SameLine(); HelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                    ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                    ImGui::Text("Fallback character: '%c' (U+%04X)", font->FallbackChar, font->FallbackChar);
                    ImGui::Text("Ellipsis character: '%c' (U+%04X)", font->EllipsisChar, font->EllipsisChar);
                    const float surface_sqrt = sqrtf((float)font->MetricsTotalSurface);
                    ImGui::Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, (int)surface_sqrt, (int)surface_sqrt);
                    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                        if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                            ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                    if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                    {
                        // Display all glyphs of the fonts in separate pages of 256 characters
                        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
                        {
                            int count = 0;
                            for (unsigned int n = 0; n < 256; n++)
                                count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                            if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                            {
                                float cell_size = font->FontSize * 1;
                                float cell_spacing = style.ItemSpacing.y;
                                ImVec2 base_pos = ImGui::GetCursorScreenPos();
                                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                                for (unsigned int n = 0; n < 256; n++)
                                {
                                    ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                    ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                    const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                                    draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                                    if (glyph)
                                        font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base + n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                    if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                    {
                                        ImGui::BeginTooltip();
                                        ImGui::Text("Codepoint: U+%04X", base + n);
                                        ImGui::Separator();
                                        ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                        ImGui::EndTooltip();
                                    }
                                }
                                ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                                ImGui::TreePop();
                            }
                        }
                        ImGui::TreePop();
                    }
                    ImGui::TreePop();
                }
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            HelpMarker("Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.2f"))   // scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.2f");      // scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, "%.2f", ImGuiSliderFlags_Logarithmic);
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;
            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}